

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool gen_branch(DisasContext_conflict12 *ctx,arg_b *a,TCGCond cond)

{
  TCGContext_conflict11 *s;
  target_ulong tVar1;
  undefined1 extraout_AL;
  TCGLabel *l;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_riscv64(s);
  t = tcg_temp_new_i64(s);
  t_00 = tcg_temp_new_i64(s);
  gen_get_gpr(s,t,a->rs1);
  gen_get_gpr(s,t_00,a->rs2);
  tcg_gen_brcond_i64_riscv64(s,cond,t,t_00,l);
  gen_goto_tb(ctx,1,ctx->pc_succ_insn);
  gen_set_label(s,l);
  tVar1 = (ctx->base).pc_next;
  if (((ctx->misa & 4) == 0) && (((int)tVar1 + a->imm & 3U) != 0)) {
    gen_exception_inst_addr_mis(ctx);
  }
  else {
    gen_goto_tb(ctx,0,tVar1 + (long)a->imm);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(t + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(t_00 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_branch(DisasContext *ctx, int insn_bytes)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        int proc_hflags = ctx->hflags & MIPS_HFLAG_BMASK;
        /* Branches completion */
        clear_branch_hflags(ctx);
        ctx->base.is_jmp = DISAS_NORETURN;
        /* FIXME: Need to clear can_do_io.  */
        switch (proc_hflags & MIPS_HFLAG_BMASK_BASE) {
        case MIPS_HFLAG_FBNSLOT:
            gen_goto_tb(ctx, 0, ctx->base.pc_next + insn_bytes);
            break;
        case MIPS_HFLAG_B:
            /* unconditional branch */
            if (proc_hflags & MIPS_HFLAG_BX) {
                tcg_gen_xori_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, MIPS_HFLAG_M16);
            }
            gen_goto_tb(ctx, 0, ctx->btarget);
            break;
        case MIPS_HFLAG_BL:
            /* blikely taken case */
            gen_goto_tb(ctx, 0, ctx->btarget);
            break;
        case MIPS_HFLAG_BC:
            /* Conditional branch */
            {
                TCGLabel *l1 = gen_new_label(tcg_ctx);

                tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, 0, l1);
                gen_goto_tb(ctx, 1, ctx->base.pc_next + insn_bytes);
                gen_set_label(tcg_ctx, l1);
                gen_goto_tb(ctx, 0, ctx->btarget);
            }
            break;
        case MIPS_HFLAG_BR:
            /* unconditional branch to register */
            if (ctx->insn_flags & (ASE_MIPS16 | ASE_MICROMIPS)) {
                TCGv t0 = tcg_temp_new(tcg_ctx);
                TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->btarget, 0x1);
                tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
                tcg_temp_free(tcg_ctx, t0);
                tcg_gen_andi_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, ~(uint32_t)MIPS_HFLAG_M16);
                tcg_gen_shli_i32(tcg_ctx, t1, t1, MIPS_HFLAG_M16_SHIFT);
                tcg_gen_or_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, t1);
                tcg_temp_free_i32(tcg_ctx, t1);

                tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget, ~(target_ulong)0x1);
            } else {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget);
            }
            if (ctx->base.singlestep_enabled) {
                save_cpu_state(ctx, 0);
                gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
            }
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        default:
            fprintf(stderr, "unknown branch 0x%x\n", proc_hflags);
            abort();
        }
    }
}